

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  int iVar1;
  int local_2c;
  int idx;
  int v;
  int base_local;
  expdesc *var_local;
  TString *n_local;
  FuncState *fs_local;
  
  if (fs == (FuncState *)0x0) {
    init_exp(var,VVOID,0);
  }
  else {
    iVar1 = searchvar(fs,n,var);
    if (iVar1 < 0) {
      local_2c = searchupvalue(fs,n);
      if (local_2c < 0) {
        singlevaraux(fs->prev,n,var,0);
        if ((var->k != VLOCAL) && (var->k != VUPVAL)) {
          return;
        }
        local_2c = newupvalue(fs,n,var);
      }
      init_exp(var,VUPVAL,local_2c);
    }
    else if ((iVar1 == 9) && (base == 0)) {
      markupval(fs,(uint)(var->u).var.vidx);
    }
  }
  return;
}

Assistant:

static void singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    init_exp(var, VVOID, 0);  /* default is global */
  else {
    int v = searchvar(fs, n, var);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      if (v == VLOCAL && !base)
        markupval(fs, var->u.var.vidx);  /* local will be used as an upval */
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        singlevaraux(fs->prev, n, var, 0);  /* try upper levels */
        if (var->k == VLOCAL || var->k == VUPVAL)  /* local or upvalue? */
          idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
        else  /* it is a global or a constant */
          return;  /* don't need to do anything at this level */
      }
      init_exp(var, VUPVAL, idx);  /* new or old upvalue */
    }
  }
}